

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

aiMaterial * __thiscall Assimp::D3MF::XmlSerializer::readMaterialDef(XmlSerializer *this)

{
  size_type sVar1;
  __type _Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiMaterial *this_00;
  allocator<char> local_499;
  string stdMatName;
  string local_478 [32];
  string strId;
  string nodeName;
  aiString matName;
  
  iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nodeName,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)&matName);
  _Var2 = std::operator==(&nodeName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          XmlTag::basematerials_base_abi_cxx11_);
  if (_Var2) {
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                      (this->xmlReader,XmlTag::basematerials_name_abi_cxx11_);
    stdMatName._M_dataplus._M_p = (pointer)&stdMatName.field_2;
    stdMatName._M_string_length = 0;
    stdMatName.field_2._M_local_buf[0] = '\0';
    matName.length = 0;
    matName.data[0] = '\0';
    memset(matName.data + 1,0x1b,0x3ff);
    to_string<unsigned_int>(&strId,this->mActiveMatGroup);
    std::__cxx11::string::append((char *)&stdMatName);
    std::__cxx11::string::append((string *)&stdMatName);
    std::__cxx11::string::append((char *)&stdMatName);
    if ((char *)CONCAT44(extraout_var_00,iVar3) == (char *)0x0) {
      std::__cxx11::string::append((char *)&stdMatName);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                (local_478,(char *)CONCAT44(extraout_var_00,iVar3),&local_499);
      std::__cxx11::string::append((string *)&stdMatName);
      std::__cxx11::string::~string(local_478);
    }
    sVar1 = stdMatName._M_string_length;
    if (stdMatName._M_string_length < 0x400) {
      matName.length = (ai_uint32)stdMatName._M_string_length;
      memcpy(matName.data,stdMatName._M_dataplus._M_p,stdMatName._M_string_length);
      matName.data[sVar1] = '\0';
    }
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    aiMaterial::AddProperty(this_00,&matName,"?mat.name",0,0);
    assignDiffuseColor(this,this_00);
    std::__cxx11::string::~string((string *)&strId);
    std::__cxx11::string::~string((string *)&stdMatName);
  }
  else {
    this_00 = (aiMaterial *)0x0;
  }
  std::__cxx11::string::~string((string *)&nodeName);
  return this_00;
}

Assistant:

aiMaterial *readMaterialDef() {
        aiMaterial *mat( nullptr );
        const char *name( nullptr );
        const std::string nodeName( xmlReader->getNodeName() );
        if ( nodeName == D3MF::XmlTag::basematerials_base ) {
            name = xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_name.c_str() );
            std::string stdMatName;
            aiString matName;
            std::string strId( to_string( mActiveMatGroup ) );
            stdMatName += "id";
            stdMatName += strId;
            stdMatName += "_";
            if ( nullptr != name ) {
                stdMatName += std::string( name );
            } else {
                stdMatName += "basemat";
            }
            matName.Set( stdMatName );

            mat = new aiMaterial;
            mat->AddProperty( &matName, AI_MATKEY_NAME );

            assignDiffuseColor( mat );
        }

        return mat;
    }